

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkPointTriface.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChLinkPointTriface::IntLoadConstraint_C
          (ChLinkPointTriface *this,uint off_L,ChVectorDynamic<> *Qc,double c,bool do_clamp,
          double recovery_clamp)

{
  double dVar1;
  double dVar2;
  element_type *peVar3;
  element_type *peVar4;
  element_type *peVar5;
  ulong uVar6;
  double *pdVar7;
  double dVar8;
  double dVar9;
  undefined1 auVar10 [16];
  bool bVar11;
  undefined1 auVar12 [16];
  int iVar13;
  ulong uVar14;
  ulong uVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  double dVar21;
  undefined1 auVar22 [16];
  double dVar23;
  undefined8 in_XMM1_Qb;
  undefined1 auVar24 [16];
  double dVar25;
  undefined1 auVar26 [16];
  double dVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  double dVar34;
  double dVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  
  uVar14 = (ulong)off_L;
  iVar13 = (*(this->super_ChLinkBase).super_ChPhysicsItem.super_ChObj._vptr_ChObj[9])();
  if ((char)iVar13 == '\0') {
    return;
  }
  peVar3 = (this->mtriangle).mnodeB2.
           super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  peVar4 = (this->mtriangle).mnodeB1.
           super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  peVar5 = (this->mtriangle).mnodeB3.
           super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  dVar21 = *(double *)&peVar4->field_0x28;
  auVar30._8_8_ = 0;
  auVar30._0_8_ = *(double *)&peVar5->field_0x28;
  dVar1 = *(double *)&peVar4->field_0x30;
  dVar25 = *(double *)&(peVar3->super_ChNodeFEAbase).field_0x20;
  dVar23 = *(double *)&(peVar4->super_ChNodeFEAbase).field_0x20;
  auVar33._8_8_ = 0;
  auVar33._0_8_ = *(double *)&peVar5->field_0x30;
  dVar2 = *(double *)&(peVar5->super_ChNodeFEAbase).field_0x20;
  auVar29._8_8_ = 0;
  auVar29._0_8_ = dVar2;
  peVar4 = (this->mnodeA).super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  dVar27 = *(double *)&peVar3->field_0x30 - dVar1;
  dVar34 = *(double *)&peVar5->field_0x28 - dVar21;
  dVar35 = dVar25 - dVar23;
  dVar8 = *(double *)&peVar3->field_0x28 - dVar21;
  dVar9 = *(double *)&peVar5->field_0x30 - dVar1;
  dVar2 = dVar2 - dVar23;
  auVar28._8_8_ = 0;
  auVar28._0_8_ = dVar8;
  auVar36._8_8_ = 0;
  auVar36._0_8_ = dVar9;
  auVar39._8_8_ = 0;
  auVar39._0_8_ = dVar34 * dVar27;
  auVar28 = vfmsub231sd_fma(auVar39,auVar28,auVar36);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = dVar27;
  auVar31._8_8_ = 0;
  auVar31._0_8_ = dVar2;
  auVar37._8_8_ = 0;
  auVar37._0_8_ = dVar9 * dVar35;
  auVar16 = vfmsub231sd_fma(auVar37,auVar31,auVar19);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = dVar35;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = dVar2 * dVar8;
  auVar32._8_8_ = 0;
  auVar32._0_8_ = dVar34;
  auVar20 = vfmsub231sd_fma(auVar18,auVar20,auVar32);
  dVar34 = auVar16._0_8_;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = dVar34 * dVar34;
  auVar16 = vfmadd231sd_fma(auVar17,auVar28,auVar28);
  auVar16 = vfmadd231sd_fma(auVar16,auVar20,auVar20);
  auVar16 = vsqrtsd_avx(auVar16,auVar16);
  bVar11 = 2.2250738585072014e-308 <= auVar16._0_8_;
  dVar27 = 1.0 / auVar16._0_8_;
  dVar2 = this->s2;
  auVar38._8_8_ = 0;
  auVar38._0_8_ = 1.0 - dVar2;
  auVar41._8_8_ = 0;
  auVar41._0_8_ = this->s3;
  auVar16 = vsubsd_avx512f(auVar38,auVar41);
  dVar35 = auVar16._0_8_;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = dVar35 * dVar21;
  auVar40._8_8_ = 0;
  auVar40._0_8_ = *(ulong *)&peVar4->field_0x28;
  auVar16 = vsubsd_avx512f(auVar40,auVar16);
  auVar17 = vmulsd_avx512f(auVar29,auVar41);
  auVar42._8_8_ = 0;
  auVar42._0_8_ = this->s3;
  auVar18 = vmulsd_avx512f(auVar30,auVar42);
  auVar19 = vmulsd_avx512f(auVar33,auVar42);
  dVar21 = this->d;
  dVar25 = ((((*(double *)&(peVar4->super_ChNodeFEAbase).field_0x20 - dVar35 * dVar23) -
             dVar25 * dVar2) - auVar17._0_8_) -
           (double)((ulong)bVar11 * (long)(auVar28._0_8_ * dVar27) +
                   (ulong)!bVar11 * 0x3ff0000000000000) * dVar21) * c;
  dVar23 = (((auVar16._0_8_ - *(double *)&peVar3->field_0x28 * dVar2) - auVar18._0_8_) -
           (double)((ulong)bVar11 * (long)(dVar34 * dVar27)) * dVar21) * c;
  dVar21 = ((((*(double *)&peVar4->field_0x30 - dVar35 * dVar1) -
             *(double *)&peVar3->field_0x30 * dVar2) - auVar19._0_8_) -
           dVar21 * (double)((ulong)bVar11 * (long)(auVar20._0_8_ * dVar27))) * c;
  if (do_clamp) {
    auVar12._8_8_ = in_XMM1_Qb;
    auVar12._0_8_ = recovery_clamp;
    auVar10._8_8_ = 0x8000000000000000;
    auVar10._0_8_ = 0x8000000000000000;
    auVar20 = vxorpd_avx512vl(auVar12,auVar10);
    auVar26._8_8_ = 0;
    auVar26._0_8_ = dVar25;
    auVar16 = vmaxsd_avx(auVar26,auVar20);
    auVar24._8_8_ = 0;
    auVar24._0_8_ = dVar23;
    auVar28 = vmaxsd_avx(auVar24,auVar20);
    auVar22._8_8_ = 0;
    auVar22._0_8_ = dVar21;
    auVar20 = vmaxsd_avx(auVar22,auVar20);
    auVar16 = vminsd_avx(auVar16,auVar12);
    dVar25 = auVar16._0_8_;
    auVar16 = vminsd_avx(auVar28,auVar12);
    dVar23 = auVar16._0_8_;
    auVar16 = vminsd_avx(auVar20,auVar12);
    dVar21 = auVar16._0_8_;
  }
  uVar6 = (Qc->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  if ((long)uVar14 < (long)uVar6) {
    pdVar7 = (Qc->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    pdVar7[uVar14] = dVar25 + pdVar7[uVar14];
    uVar14 = (ulong)(off_L + 1);
    if (uVar14 < uVar6) {
      uVar15 = (ulong)(off_L + 2);
      pdVar7[uVar14] = dVar23 + pdVar7[uVar14];
      if (uVar15 < uVar6) {
        pdVar7[uVar15] = dVar21 + pdVar7[uVar15];
        return;
      }
    }
  }
  __assert_fail("index >= 0 && index < size()",
                "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
               );
}

Assistant:

void ChLinkPointTriface::IntLoadConstraint_C(const unsigned int off_L,  // offset in Qc residual
                                             ChVectorDynamic<>& Qc,     // result: the Qc residual, Qc += c*C
                                             const double c,            // a scaling factor
                                             bool do_clamp,             // apply clamping to c*C?
                                             double recovery_clamp      // value for min/max clamping of c*C
) {
    if (!IsActive())
        return;

    // Compute residual of constraint as distance of two points: one is A,
    // other is on triangle at the s2,s3 area coordinates:
    //  C = A - s1*B1 - s2*B2 - s3*B3
    // If an offset d is desired, along normal N, this becomes:
    //  C = A - s1*B1 - s2*B2 - s3*B3 - d*N

    ChVector<> N =
        Vcross(mtriangle.mnodeB2->pos - mtriangle.mnodeB1->pos, mtriangle.mnodeB3->pos - mtriangle.mnodeB1->pos);
    N.Normalize();
    double s1 = 1 - s2 - s3;

    ChVector<> res = mnodeA->GetPos() - s1 * mtriangle.mnodeB1->pos - s2 * mtriangle.mnodeB2->pos -
                     s3 * mtriangle.mnodeB3->pos - N * d;

    ChVector<> cres = res * c;

    if (do_clamp) {
        cres.x() = ChMin(ChMax(cres.x(), -recovery_clamp), recovery_clamp);
        cres.y() = ChMin(ChMax(cres.y(), -recovery_clamp), recovery_clamp);
        cres.z() = ChMin(ChMax(cres.z(), -recovery_clamp), recovery_clamp);
    }
    Qc(off_L + 0) += cres.x();
    Qc(off_L + 1) += cres.y();
    Qc(off_L + 2) += cres.z();
}